

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token)

{
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  _Elt_pointer ppVVar4;
  Location pCVar5;
  bool bVar6;
  _Elt_pointer ppVVar7;
  _Elt_pointer ppVVar8;
  String decoded_string;
  Value decoded;
  String local_68;
  ValueHolder local_48;
  anon_struct_4_2_14fb5ae2_for_bits_ local_40;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar6 = decodeString(this,token,&local_68);
  if (bVar6) {
    Value::Value((Value *)&local_48,&local_68);
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = &ppVVar7[-1]->value_;
    aVar1 = *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1);
    *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1) = local_40;
    VVar3 = *pVVar2;
    *pVVar2 = local_48;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar8 = ppVVar7;
    if (ppVVar7 == ppVVar4) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar5 = this->begin_;
    ppVVar8[-1]->start_ = (long)token->start_ - (long)pCVar5;
    if (ppVVar7 == ppVVar4) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar7[-1]->limit_ = (long)token->end_ - (long)pCVar5;
    local_48 = VVar3;
    local_40 = aVar1;
    Value::~Value((Value *)&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool OurReader::decodeString(Token& token) {
  String decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}